

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O1

TConstUnion __thiscall glslang::TConstUnion::operator<<(TConstUnion *this,TConstUnion *constant)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  TConstUnion TVar6;
  
  switch(this->type) {
  case EbtInt8:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
switchD_003ecde8_caseD_4:
      uVar1 = (uint)(this->field_0).u8Const << ((constant->field_0).u8Const & 0x1f);
      uVar3 = 0;
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x285,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint8:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
      goto switchD_003ecde8_caseD_4;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x292,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
  case EbtInt16:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
switchD_003ecd9c_caseD_4:
      uVar1 = (uint)(this->field_0).u16Const << ((constant->field_0).u8Const & 0x1f);
      uVar3 = uVar1 >> 8;
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x29f,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    break;
  case EbtUint16:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
      goto switchD_003ecd9c_caseD_4;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2ac,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
  case EbtInt:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
switchD_003ece14_caseD_4:
      uVar1 = (this->field_0).uConst << ((constant->field_0).u8Const & 0x1f);
      uVar3 = uVar1 >> 8;
      uVar4 = uVar1 >> 0x10;
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2d3,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    goto LAB_003ece26;
  case EbtUint:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
      goto switchD_003ece14_caseD_4;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2e0,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
  case EbtInt64:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
switchD_003ecdc9_caseD_4:
      uVar2 = (this->field_0).u64Const << ((constant->field_0).u8Const & 0x3f);
      uVar3 = (uint)(uVar2 >> 8);
      uVar4 = (uint)(uVar2 >> 0x10);
      uVar5 = uVar2 & 0xffffffff00000000;
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2b9,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
    goto LAB_003ece6c;
  case EbtUint64:
    switch(constant->type) {
    case EbtInt8:
    case EbtUint8:
    case EbtInt16:
    case EbtUint16:
    case EbtInt:
    case EbtUint:
    case EbtInt64:
    case EbtUint64:
      goto switchD_003ecdc9_caseD_4;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x2c6,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const"
                   );
    }
  default:
    __assert_fail("false && \"Default missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x2e3,"TConstUnion glslang::TConstUnion::operator<<(const TConstUnion &) const");
  }
  uVar4 = 0;
LAB_003ece26:
  uVar2 = (ulong)uVar1;
  uVar5 = 0;
LAB_003ece6c:
  TVar6.field_0 = ((uVar3 & 0xff) << 8 | (uint)uVar2 & 0xff | uVar4 << 0x10) | uVar5;
  TVar6.type = this->type;
  TVar6._12_4_ = 0;
  return TVar6;
}

Assistant:

TConstUnion operator<<(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        switch (type) {
        case EbtInt8:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI8Const(i8Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI8Const(i8Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI8Const(i8Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI8Const(i8Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI8Const(i8Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI8Const(i8Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI8Const(i8Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI8Const(i8Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint8:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU8Const(u8Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU8Const(u8Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU8Const(u8Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU8Const(u8Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU8Const(u8Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU8Const(u8Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU8Const(u8Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU8Const(u8Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtInt16:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI16Const(i16Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI16Const(i16Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI16Const(i16Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI16Const(i16Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI16Const(i16Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI16Const(i16Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI16Const(i16Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI16Const(i16Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint16:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU16Const(u16Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU16Const(u16Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU16Const(u16Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU16Const(u16Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU16Const(u16Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU16Const(u16Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU16Const(u16Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU16Const(u16Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
         case EbtInt64:
            switch (constant.type) {
            case EbtInt8:   returnValue.setI64Const(i64Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setI64Const(i64Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setI64Const(i64Const << constant.i16Const); break;
            case EbtUint16: returnValue.setI64Const(i64Const << constant.u16Const); break;
            case EbtInt:    returnValue.setI64Const(i64Const << constant.iConst);   break;
            case EbtUint:   returnValue.setI64Const(i64Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setI64Const(i64Const << constant.i64Const); break;
            case EbtUint64: returnValue.setI64Const(i64Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint64:
            switch (constant.type) {
            case EbtInt8:   returnValue.setU64Const(u64Const << constant.i8Const);  break;
            case EbtUint8:  returnValue.setU64Const(u64Const << constant.u8Const);  break;
            case EbtInt16:  returnValue.setU64Const(u64Const << constant.i16Const); break;
            case EbtUint16: returnValue.setU64Const(u64Const << constant.u16Const); break;
            case EbtInt:    returnValue.setU64Const(u64Const << constant.iConst);   break;
            case EbtUint:   returnValue.setU64Const(u64Const << constant.uConst);   break;
            case EbtInt64:  returnValue.setU64Const(u64Const << constant.i64Const); break;
            case EbtUint64: returnValue.setU64Const(u64Const << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtInt:
            switch (constant.type) {
            case EbtInt:    returnValue.setIConst(iConst << constant.iConst);   break;
            case EbtUint:   returnValue.setIConst(iConst << constant.uConst);   break;
            case EbtInt8:   returnValue.setIConst(iConst << constant.i8Const);  break;
            case EbtUint8:  returnValue.setIConst(iConst << constant.u8Const);  break;
            case EbtInt16:  returnValue.setIConst(iConst << constant.i16Const); break;
            case EbtUint16: returnValue.setIConst(iConst << constant.u16Const); break;
            case EbtInt64:  returnValue.setIConst(iConst << constant.i64Const); break;
            case EbtUint64: returnValue.setIConst(iConst << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        case EbtUint:
            switch (constant.type) {
            case EbtInt:    returnValue.setUConst(uConst << constant.iConst);   break;
            case EbtUint:   returnValue.setUConst(uConst << constant.uConst);   break;
            case EbtInt8:   returnValue.setUConst(uConst << constant.i8Const);  break;
            case EbtUint8:  returnValue.setUConst(uConst << constant.u8Const);  break;
            case EbtInt16:  returnValue.setUConst(uConst << constant.i16Const); break;
            case EbtUint16: returnValue.setUConst(uConst << constant.u16Const); break;
            case EbtInt64:  returnValue.setUConst(uConst << constant.i64Const); break;
            case EbtUint64: returnValue.setUConst(uConst << constant.u64Const); break;
            default:       assert(false && "Default missing");
            }
            break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }